

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int fits_hcompress(int *a,int ny,int nx,int scale,char *output,long *nbytes,int *status)

{
  int iVar1;
  int stat;
  long *nbytes_local;
  char *output_local;
  int scale_local;
  int nx_local;
  int ny_local;
  int *a_local;
  
  if (*status < 1) {
    iVar1 = htrans(a,nx,ny);
    if (iVar1 == 0) {
      digitize(a,nx,ny,scale);
      noutmax = *nbytes;
      *nbytes = 0;
      iVar1 = encode(output,nbytes,a,nx,ny,scale);
      *status = iVar1;
      a_local._4_4_ = *status;
    }
    else {
      *status = iVar1;
      a_local._4_4_ = *status;
    }
  }
  else {
    a_local._4_4_ = *status;
  }
  return a_local._4_4_;
}

Assistant:

int fits_hcompress(int *a, int ny, int nx, int scale, char *output, 
                  long *nbytes, int *status)
{
  /* 
     compress the input image using the H-compress algorithm
  
   a  - input image array
   nx - size of X axis of image
   ny - size of Y axis of image
   scale - quantization scale factor. Larger values results in more (lossy) compression
           scale = 0 does lossless compression
   output - pre-allocated array to hold the output compressed stream of bytes
   nbyts  - input value = size of the output buffer;
            returned value = size of the compressed byte stream, in bytes

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */

  int stat;
  
  if (*status > 0) return(*status);

  /* H-transform */
  stat = htrans(a, nx, ny);
  if (stat) {
     *status = stat;
     return(*status);
  }

  /* digitize */
  digitize(a, nx, ny, scale);

  /* encode and write to output array */

  FFLOCK;
  noutmax = *nbytes;  /* input value is the allocated size of the array */
  *nbytes = 0;  /* reset */

  stat = encode(output, nbytes, a, nx, ny, scale);
  FFUNLOCK;
  
  *status = stat;
  return(*status);
}